

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyz::NodeIntStateScatter
          (ChNodeFEAxyz *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  double *local_70;
  undefined8 local_68;
  ChState *local_58;
  ulong local_50;
  long local_40;
  ChVector<double> local_38;
  
  local_50 = (ulong)off_x;
  local_70 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_50;
  local_40 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_68 = 3;
  local_58 = x;
  if ((long)local_50 <= local_40 + -3) {
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_38,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_70,(type *)0x0);
    if ((ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20 != &local_38) {
      *(double *)&(this->super_ChNodeFEAbase).field_0x20 = local_38.m_data[0];
      *(double *)&this->field_0x28 = local_38.m_data[1];
      *(double *)&this->field_0x30 = local_38.m_data[2];
    }
    local_50 = (ulong)off_v;
    local_70 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_50;
    local_40 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_68 = 3;
    local_58 = (ChState *)v;
    if ((long)local_50 <= local_40 + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_38,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_70,(type *)0x0);
      if ((ChVector<double> *)&this->field_0x38 != &local_38) {
        *(double *)&this->field_0x38 = local_38.m_data[0];
        *(double *)&this->field_0x40 = local_38.m_data[1];
        *(double *)&this->field_0x48 = local_38.m_data[2];
      }
      return;
    }
  }
  local_68 = 3;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void NodeIntStateScatter(const unsigned int off_x,
                                     const ChState& x,
                                     const unsigned int off_v,
                                     const ChStateDelta& v,
                                     const double T) override {
        SetPos(x.segment(off_x, 3));
        SetPos_dt(v.segment(off_v, 3));
    }